

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reachability_graph.hh
# Opt level: O2

void __thiscall
tchecker::graph::reachability::
multigraph_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>::
multigraph_t(multigraph_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
             *this,size_t block_size)

{
  this->_vptr_multigraph_t = (_func_int **)&PTR__multigraph_t_00288578;
  (this->_store_graph)._nodes.
  super__Vector_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_store_graph)._nodes.
  super__Vector_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_store_graph)._nodes.
  super__Vector_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  node_pool_allocator_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>
  ::node_pool_allocator_t(&this->_node_pool,block_size);
  edge_pool_allocator_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>
  ::edge_pool_allocator_t(&this->_edge_pool,block_size);
  return;
}

Assistant:

multigraph_t(std::size_t block_size) : _store_graph(), _node_pool(block_size), _edge_pool(block_size) {}